

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O1

void __thiscall hiberlite::Database::createModel(Database *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  logic_error *this_00;
  long *plVar7;
  _Self __tmp;
  string query;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Model mdl;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Database *local_90;
  _Rb_tree_node_base *local_88;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
  local_60;
  
  local_90 = this;
  if (this->mx != (ModelExtractor *)0x0) {
    ModelExtractor::getModel((Model *)&local_60,this->mx);
    if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_60._M_impl.super__Rb_tree_header) {
      paVar1 = &local_b0.field_2;
      p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        std::operator+(&local_b0,"CREATE TABLE ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var6 + 2));
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_d0 = &local_c0;
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_c0 = *plVar7;
          lStack_b8 = plVar4[3];
        }
        else {
          local_c0 = *plVar7;
          local_d0 = (long *)*plVar4;
        }
        local_c8 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != paVar1) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        p_Var5 = p_Var6[3]._M_right;
        local_88 = p_Var6;
        if (p_Var5 != (_Rb_tree_node_base *)&p_Var6[3]._M_parent) {
          bVar2 = false;
          do {
            if (bVar2) {
              std::__cxx11::string::append((char *)&local_d0);
            }
            local_b0._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,*(long *)(p_Var5 + 2),
                       (long)&(p_Var5[2]._M_parent)->_M_color + *(long *)(p_Var5 + 2));
            std::__cxx11::string::append((char *)&local_b0);
            std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_b0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != paVar1) {
              operator_delete(local_b0._M_dataplus._M_p);
            }
            iVar3 = std::__cxx11::string::compare((char *)(p_Var5 + 2));
            if (iVar3 == 0) {
              std::__cxx11::string::append((char *)&local_d0);
            }
            else {
              std::__cxx11::string::_M_append((char *)&local_d0,*(ulong *)(p_Var5 + 3));
            }
            p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
            bVar2 = true;
          } while (p_Var5 != (_Rb_tree_node_base *)&p_Var6[3]._M_parent);
        }
        std::__cxx11::string::append((char *)&local_d0);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_d0,local_c8 + (long)local_d0);
        dbExecQuery(local_90,&local_80);
        p_Var5 = local_88;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
        if (local_d0 != &local_c0) {
          operator_delete(local_d0);
        }
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var6 != &local_60._M_impl.super__Rb_tree_header);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
    ::~_Rb_tree(&local_60);
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"register bean classes first");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void Database::createModel()
{
	if(!mx)
		throw std::logic_error("register bean classes first");
	Model mdl=mx->getModel();
	for(Model::iterator it=mdl.begin();it!=mdl.end();it++){
		Table& t=it->second;
		std::string query="CREATE TABLE "+t.name+" (";
		bool needComma=false;
		for(std::map<std::string,Column>::iterator c=t.columns.begin();c!=t.columns.end();c++){
			if(needComma)
				query+=", ";
			needComma=true;
			Column& col=c->second;
			query += col.name + " ";
			if(col.name==HIBERLITE_PRIMARY_KEY_COLUMN)
				query+="INTEGER PRIMARY KEY AUTOINCREMENT";
			else
				query+=col.storage_type;
		}
		query +=");";
		dbExecQuery(query);
	}
}